

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O3

List __thiscall xt::list::cons(list *this,Object *o)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  List LVar2;
  List local_38;
  Object local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_38.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = EMPTY;
  local_38.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_0010c358;
  if (DAT_0010c358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_0010c358->_M_use_count = DAT_0010c358->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_0010c358->_M_use_count = DAT_0010c358->_M_use_count + 1;
    }
  }
  Object::Object(&local_28,o);
  LVar2 = cons(this,&local_38,&local_28);
  _Var1 = LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    _Var1._M_pi = extraout_RDX;
  }
  LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (List)LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

List cons(Object o) {
	return cons(EMPTY, o);
}